

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void __thiscall
kratos::EnumPort::EnumPort
          (EnumPort *this,Generator *m,PortDirection direction,string *name,
          shared_ptr<kratos::Enum> *enum_type)

{
  Var::Var((Var *)this,m,name,
           ((enum_type->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           width_,1,false,PortIO);
  (this->super_Port).direction_ = direction;
  (this->super_Port).type_ = Data;
  (this->super_Port).active_high_.super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->super_Port).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b4c88;
  (this->super_EnumType)._vptr_EnumType = (_func_int **)&DAT_002b4e00;
  this->enum_type_ =
       (enum_type->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  return;
}

Assistant:

EnumPort::EnumPort(kratos::Generator* m, kratos::PortDirection direction, const std::string& name,
                   const std::shared_ptr<Enum>& enum_type)
    : Port(m, direction, name, enum_type->width(), 1, PortType::Data, false),
      enum_type_(enum_type.get()) {}